

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection_handle.cpp
# Opt level: O0

bool __thiscall
libtorrent::bt_peer_connection_handle::supports_encryption(bt_peer_connection_handle *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_20 [8];
  shared_ptr<libtorrent::aux::bt_peer_connection> pc;
  bt_peer_connection_handle *this_local;
  
  pc.super___shared_ptr<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  native_handle((bt_peer_connection_handle *)local_20);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::bt_peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_20);
  bVar1 = libtorrent::aux::bt_peer_connection::supports_encryption(this_00);
  ::std::shared_ptr<libtorrent::aux::bt_peer_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::bt_peer_connection> *)local_20);
  return bVar1;
}

Assistant:

bool bt_peer_connection_handle::supports_encryption() const
{
#if !defined TORRENT_DISABLE_ENCRYPTION
	std::shared_ptr<aux::bt_peer_connection> pc = native_handle();
	TORRENT_ASSERT(pc);
	return pc->supports_encryption();
#else
	return false;
#endif
}